

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smc.cpp
# Opt level: O3

void __thiscall SMC::SMC(SMC *this,Structure *nativeConf,Params *params)

{
  Structure *this_00;
  Structure *this_01;
  int iVar1;
  int iVar2;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->Conf;
  Structure::Structure(this_00,1);
  this_01 = &this->_conf;
  Structure::Structure(this_01,1);
  (this->MultiLooplib).
  super__Vector_base<std::vector<Structure,_std::allocator<Structure>_>,_std::allocator<std::vector<Structure,_std::allocator<Structure>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MultiLooplib).
  super__Vector_base<std::vector<Structure,_std::allocator<Structure>_>,_std::allocator<std::vector<Structure,_std::allocator<Structure>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LoopStore).super__Vector_base<Structure,_std::allocator<Structure>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->MultiLooplib).
  super__Vector_base<std::vector<Structure,_std::allocator<Structure>_>,_std::allocator<std::vector<Structure,_std::allocator<Structure>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LoopStore).super__Vector_base<Structure,_std::allocator<Structure>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LoopStore).super__Vector_base<Structure,_std::allocator<Structure>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->prot_name)._M_dataplus._M_p = (pointer)&(this->prot_name).field_2;
  (this->prot_name)._M_string_length = 0;
  (this->prot_name).field_2._M_local_buf[0] = '\0';
  (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->cfe).m_broad_phase.m_impl.m_inv_cell_diameter = 0.0;
  (this->cfe).m_broad_phase.m_impl.m_min_coord = 0.0;
  (this->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->ends).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->ends).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->ends).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->cfe).m_broad_phase.m_impl.m_grid._M_h._M_buckets =
       &(this->cfe).m_broad_phase.m_impl.m_grid._M_h._M_single_bucket;
  (this->cfe).m_broad_phase.m_impl.m_grid._M_h._M_bucket_count = 1;
  (this->cfe).m_broad_phase.m_impl.m_grid._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cfe).m_broad_phase.m_impl.m_grid._M_h._M_element_count = 0;
  (this->cfe).m_broad_phase.m_impl.m_grid._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->cfe).m_membrane.m_atoms.
  super__Vector_base<Membrane::atom_t,_std::allocator<Membrane::atom_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cfe).m_membrane.m_grid.m_inv_cell_diameter = 0.0;
  (this->cfe).m_membrane.m_atoms.
  super__Vector_base<Membrane::atom_t,_std::allocator<Membrane::atom_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cfe).m_membrane.m_atoms.
  super__Vector_base<Membrane::atom_t,_std::allocator<Membrane::atom_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cfe).m_broad_phase.m_impl.m_grid._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cfe).m_broad_phase.m_impl.m_grid._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->cfe).m_membrane.m_grid.m_min_coord = 0.0;
  (this->cfe).m_membrane.m_grid.m_grid._M_h._M_buckets =
       &(this->cfe).m_membrane.m_grid.m_grid._M_h._M_single_bucket;
  (this->cfe).m_membrane.m_grid.m_grid._M_h._M_bucket_count = 1;
  (this->cfe).m_membrane.m_grid.m_grid._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cfe).m_membrane.m_grid.m_grid._M_h._M_element_count = 0;
  (this->cfe).m_membrane.m_grid.m_grid._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->cfe).m_membrane.m_grid.m_grid._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cfe).m_membrane.m_grid.m_grid._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->NumClosedconf = 0;
  Structure::init(this_00,(EVP_PKEY_CTX *)(ulong)(uint)nativeConf->_numRes);
  Structure::init(this_01,(EVP_PKEY_CTX *)(ulong)(uint)nativeConf->_numRes);
  iVar1 = *(params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = 1;
  if (iVar1 != -1) {
    iVar2 = iVar1;
  }
  this->start = iVar2;
  iVar1 = *(params->ends).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (iVar1 == -1) {
    iVar1 = nativeConf->_numRes;
  }
  this->end = iVar1;
  Structure::operator=(this_00,nativeConf);
  Structure::mark_loop_regions(this_00,&params->starts,&params->ends);
  Structure::mark_loop_regions(this_00,&params->starts_mask,&params->ends_mask);
  std::__cxx11::string::_M_assign((string *)&this->prot_name);
  this->rand_seed = params->rand_seed;
  this->num_conf = params->num_conf;
  this->ang_type = params->ang_type;
  this->should_close = params->should_close;
  iVar1 = params->num_sc_states;
  this->num_dist_states = params->num_dist_states;
  this->num_sc_states = iVar1;
  this->conf_keep = params->conf_keep;
  this->outputconf = params->output_pdb;
  iVar1 = params->max_num_sc_clashes;
  this->max_num_bb_clashes = params->max_num_bb_clashes;
  this->max_num_sc_clashes = iVar1;
  this->max_muloop_restart = params->max_muloop_restart;
  this->max_frag_checks = params->max_frag_checks;
  this->use_multiloop_lib = params->use_multiloop_lib;
  this->use_rot_lib = params->use_rot_lib;
  std::vector<int,_std::allocator<int>_>::operator=(&this->starts,&params->starts);
  std::vector<int,_std::allocator<int>_>::operator=(&this->ends,&params->ends);
  CollisionFrontend::init(&this->cfe,(EVP_PKEY_CTX *)this_00);
  init_REDCELL(this,params);
  Structure::operator=(this_01,this_00);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"data/BBT_phi_psi_pair_NEW.txt","");
  simpBBT_Init(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (0 < params->num_dist_states) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"data/frag.N.C_pdf_32_19.txt","");
    fragdis(this,&local_70,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"data/frag.C.CA_pdf_32_19.txt","");
    fragdis(this,&local_90,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"data/LoopGeo_37_pdf_21.txt","");
    geometryinfo(this,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

SMC::SMC(const Structure &nativeConf, const struct Params &params) {
    this->NumClosedconf = 0;

    this->Conf.init(nativeConf._numRes);
    this->_conf.init(nativeConf._numRes);

    //////////////////////////////////////////////////////////////////////////

    // Set start and ending positions for fragment to be regrown (only for smc)
    this->start = (params.starts[0] == -1) ? 1 : params.starts[0];
    this->end = (params.ends[0] == -1) ? nativeConf._numRes : params.ends[0];
    this->Conf = nativeConf;
    
    // Make sure regions which need to be grown are marked in some fashion
    // to avoid inclusion in potential energy calculations
    this->Conf.mark_loop_regions(params.starts, params.ends);
    // Also mark the mask regions in the same fashion
    this->Conf.mark_loop_regions(params.starts_mask, params.ends_mask);

    // @TODO - store params structure and provide read-only accessors
    this->prot_name = params.prot_name;
    this->rand_seed = params.rand_seed;
    this->num_conf = params.num_conf;
    this->ang_type = params.ang_type;
    this->should_close = params.should_close;
    this->num_dist_states = params.num_dist_states;
    this->num_sc_states = params.num_sc_states;
    this->conf_keep = params.conf_keep;
    this->outputconf = params.output_pdb;
    this->max_num_bb_clashes = params.max_num_bb_clashes;
    this->max_num_sc_clashes = params.max_num_sc_clashes;
    this->max_muloop_restart = params.max_muloop_restart;
    this->max_frag_checks = params.max_frag_checks;
    this->use_multiloop_lib = params.use_multiloop_lib;
    this->use_rot_lib = params.use_rot_lib;
    this->starts = params.starts;
    this->ends = params.ends;

    // Initialize collision checks for static geometry
    this->cfe.init(this->Conf, params);
    
    // Initialize ellipsoid criterion
    this->init_REDCELL(params);

    // Initialize conformation to be grown with template
    this->_conf = this->Conf;

    // bbt torsion angle for joint prob sampling
    this->simpBBT_Init("data/BBT_phi_psi_pair_NEW.txt");
    if (params.num_dist_states > 0) {
        // Load fragment end-to-end distance distributions
        // Initialize conditional distributions for C and N selection
        this->fragdis(FILE_FRAG_N_C, 0);
        this->fragdis(FILE_FRAG_C_CA, 1);
        this->geometryinfo(FILE_LOOPGEO);
    }
}